

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# F3DAudio.c
# Opt level: O0

void FindSpeakerAzimuths(ConfigInfo *config,float emitterAzimuth,uint8_t skipCenter,
                        SpeakerInfo **speakerInfo)

{
  code *pcVar1;
  int iVar2;
  long *in_RDX;
  char in_SIL;
  long in_RDI;
  float in_XMM0_Da;
  SDL_AssertState sdl_assert_state_1;
  SDL_AssertState sdl_assert_state;
  float a1;
  float a0;
  uint32_t nexti;
  uint32_t i;
  float local_28;
  float local_24;
  uint local_20;
  uint local_1c;
  
  local_20 = 0;
  local_24 = 0.0;
  local_28 = 0.0;
  do {
    if (in_RDI != 0) goto LAB_0010fac2;
    iVar2 = SDL_ReportAssertion(&FindSpeakerAzimuths::sdl_assert_data,"FindSpeakerAzimuths",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/F3DAudio.c"
                                ,0x2f9);
  } while (iVar2 == 0);
  if (iVar2 == 1) {
    pcVar1 = (code *)swi(3);
    (*pcVar1)();
    return;
  }
LAB_0010fac2:
  for (local_1c = 0; local_1c < *(uint *)(in_RDI + 0x10); local_1c = local_1c + 1) {
    local_24 = *(float *)(*(long *)(in_RDI + 8) + (ulong)local_1c * 8);
    local_20 = (local_1c + 1) % *(uint *)(in_RDI + 0x10);
    local_28 = *(float *)(*(long *)(in_RDI + 8) + (ulong)local_20 * 8);
    if (local_28 <= local_24) {
      if (local_24 <= in_XMM0_Da) break;
joined_r0x0010fb70:
      if (in_XMM0_Da < local_28) break;
    }
    else if (local_24 <= in_XMM0_Da) goto joined_r0x0010fb70;
  }
  do {
    if (local_24 <= in_XMM0_Da || in_XMM0_Da < local_28) goto LAB_0010fbfb;
    iVar2 = SDL_ReportAssertion(&FindSpeakerAzimuths::sdl_assert_data_1,"FindSpeakerAzimuths",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/F3DAudio.c"
                                ,800);
  } while (iVar2 == 0);
  if (iVar2 == 1) {
    pcVar1 = (code *)swi(3);
    (*pcVar1)();
    return;
  }
LAB_0010fbfb:
  if (in_SIL != '\0') {
    if ((local_24 != 0.0) || (NAN(local_24))) {
      if ((local_28 == 0.0) &&
         ((!NAN(local_28) && (local_20 = local_20 + 1, *(uint *)(in_RDI + 0x10) <= local_20)))) {
        local_20 = local_20 - *(int *)(in_RDI + 0x10);
      }
    }
    else {
      if (local_1c == 0) {
        local_1c = *(uint *)(in_RDI + 0x10);
      }
      local_1c = local_1c - 1;
    }
  }
  *in_RDX = *(long *)(in_RDI + 8) + (ulong)local_1c * 8;
  in_RDX[1] = *(long *)(in_RDI + 8) + (ulong)local_20 * 8;
  return;
}

Assistant:

static inline void FindSpeakerAzimuths(
	const ConfigInfo* config,
	float emitterAzimuth,
	uint8_t skipCenter,
	const SpeakerInfo **speakerInfo
) {
	uint32_t i, nexti = 0;
	float a0 = 0.0f, a1 = 0.0f;

	FAudio_assert(config != NULL);

	/* We want to find, given an azimuth, which speakers are the closest
	 * ones (in terms of angle) to that azimuth.
	 * This is done by iterating through the list of speaker azimuths, as
	 * given to us by the current ConfigInfo (which stores speaker azimuths
	 * in increasing order of azimuth for each possible speaker configuration;
	 * each speaker azimuth is defined to be between 0 and 2PI by construction).
	 */
	for (i = 0; i < config->numNonLFSpeakers; i += 1)
	{
		/* a0 and a1 are the azimuths of candidate speakers */
		a0 = config->speakers[i].azimuth;
		nexti = (i + 1) % config->numNonLFSpeakers;
		a1 = config->speakers[nexti].azimuth;

		if (a0 < a1)
		{
			if (emitterAzimuth >= a0 && emitterAzimuth < a1)
			{
				break;
			}
		}
		/* It is possible for a speaker pair to enclose the singulary at 0 == 2PI:
		 * consider for example the quad config, which has a front left speaker
		 * at 7PI/4 and a front right speaker at PI/4. In that case a0 = 7PI/4 and
		 * a1 = PI/4, and the way we know whether our current azimuth lies between
		 * that pair is by checking whether the azimuth is greather than 7PI/4 or
		 * whether it's less than PI/4. (By contract, currentAzimuth is always less
		 * than 2PI.)
		 */
		else
		{
			if (emitterAzimuth >= a0 || emitterAzimuth < a1)
			{
				break;
			}
		}
	}
	FAudio_assert(emitterAzimuth >= a0 || emitterAzimuth < a1);

	/* skipCenter means that we don't want to use the center speaker.
	 * The easiest way to deal with this is to check whether either of our candidate
	 * speakers are the center, which always has an azimuth of 0.0. If that is the case
	 * we just replace it with either the previous one or the next one.
	 */
	if (skipCenter)
	{
		if (a0 == 0.0f)
		{
			if (i == 0)
			{
				i = config->numNonLFSpeakers - 1;
			}
			else
			{
				i -= 1;
			}
		}
		else if (a1 == 0.0f)
		{
			nexti += 1;
			if (nexti >= config->numNonLFSpeakers)
			{
				nexti -= config->numNonLFSpeakers;
			}
		}
	}
	speakerInfo[0] = &config->speakers[i];
	speakerInfo[1] = &config->speakers[nexti];
}